

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-spawn.c
# Opt level: O2

int run_test_spawn_stdout_and_stderr_to_file_swap(void)

{
  int iVar1;
  int iVar2;
  int iVar3;
  uv_loop_t *puVar4;
  undefined8 uVar5;
  char *pcVar6;
  uv_buf_t local_220;
  uv_fs_t fs_req;
  uv_stdio_container_t stdio [3];
  
  unlink("stdout_file");
  unlink("stderr_file");
  init_process_options("spawn_helper6",exit_cb);
  iVar1 = uv_fs_open((uv_loop_t *)0x0,&fs_req,"stdout_file",0x42,0x180,(uv_fs_cb)0x0);
  if (iVar1 == -1) {
    pcVar6 = "r != -1";
    uVar5 = 0x1fe;
  }
  else {
    uv_fs_req_cleanup(&fs_req);
    iVar1 = dup2(iVar1,1);
    if (iVar1 == -1) {
      pcVar6 = "stdout_file != -1";
      uVar5 = 0x201;
    }
    else {
      iVar2 = uv_fs_open((uv_loop_t *)0x0,&fs_req,"stderr_file",0x42,0x180,(uv_fs_cb)0x0);
      if (iVar2 == -1) {
        pcVar6 = "r != -1";
        uVar5 = 0x206;
      }
      else {
        uv_fs_req_cleanup(&fs_req);
        iVar2 = dup2(iVar2,2);
        if (iVar2 == -1) {
          pcVar6 = "stderr_file != -1";
          uVar5 = 0x209;
        }
        else {
          options.stdio = stdio;
          stdio[0].flags = UV_IGNORE;
          options.stdio_count = 3;
          stdio[1].flags = UV_INHERIT_FD;
          stdio[1].data._0_4_ = iVar2;
          stdio[2].flags = UV_INHERIT_FD;
          stdio[2].data._0_4_ = iVar1;
          puVar4 = uv_default_loop();
          iVar3 = uv_spawn(puVar4,&process,&options);
          if (iVar3 == 0) {
            puVar4 = uv_default_loop();
            iVar3 = uv_run(puVar4,UV_RUN_DEFAULT);
            if (iVar3 == 0) {
              if (exit_cb_called == 1) {
                if (close_cb_called == 1) {
                  local_220 = uv_buf_init(output,0x400);
                  iVar3 = uv_fs_read((uv_loop_t *)0x0,&fs_req,iVar1,&local_220,1,0,(uv_fs_cb)0x0);
                  if (iVar3 < 0xf) {
                    pcVar6 = "r >= 15";
                    uVar5 = 0x222;
                  }
                  else {
                    uv_fs_req_cleanup(&fs_req);
                    iVar1 = uv_fs_close((uv_loop_t *)0x0,&fs_req,iVar1,(uv_fs_cb)0x0);
                    if (iVar1 == 0) {
                      uv_fs_req_cleanup(&fs_req);
                      printf("output is: %s",output);
                      iVar1 = bcmp("hello errworld\n",output,0xf);
                      if (iVar1 == 0) {
                        iVar1 = uv_fs_read((uv_loop_t *)0x0,&fs_req,iVar2,&local_220,1,0,
                                           (uv_fs_cb)0x0);
                        if (iVar1 < 0xc) {
                          pcVar6 = "r >= 12";
                          uVar5 = 0x22e;
                        }
                        else {
                          uv_fs_req_cleanup(&fs_req);
                          iVar1 = uv_fs_close((uv_loop_t *)0x0,&fs_req,iVar2,(uv_fs_cb)0x0);
                          if (iVar1 == 0) {
                            uv_fs_req_cleanup(&fs_req);
                            printf("output is: %s",output);
                            iVar1 = bcmp("hello world\n",output,0xc);
                            if (iVar1 == 0) {
                              unlink("stdout_file");
                              unlink("stderr_file");
                              puVar4 = uv_default_loop();
                              close_loop(puVar4);
                              puVar4 = uv_default_loop();
                              iVar1 = uv_loop_close(puVar4);
                              if (iVar1 == 0) {
                                uv_library_shutdown();
                                return 0;
                              }
                              pcVar6 = "0 == uv_loop_close(uv_default_loop())";
                              uVar5 = 0x23c;
                            }
                            else {
                              pcVar6 = "strncmp(\"hello world\\n\", output, 12) == 0";
                              uVar5 = 0x236;
                            }
                          }
                          else {
                            pcVar6 = "r == 0";
                            uVar5 = 0x232;
                          }
                        }
                      }
                      else {
                        pcVar6 = "strncmp(\"hello errworld\\n\", output, 15) == 0";
                        uVar5 = 0x22a;
                      }
                    }
                    else {
                      pcVar6 = "r == 0";
                      uVar5 = 0x226;
                    }
                  }
                }
                else {
                  pcVar6 = "close_cb_called == 1";
                  uVar5 = 0x21c;
                }
              }
              else {
                pcVar6 = "exit_cb_called == 1";
                uVar5 = 0x21b;
              }
            }
            else {
              pcVar6 = "r == 0";
              uVar5 = 0x219;
            }
          }
          else {
            pcVar6 = "r == 0";
            uVar5 = 0x216;
          }
        }
      }
    }
  }
  fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
          "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/test/test-spawn.c",
          uVar5,pcVar6);
  abort();
}

Assistant:

TEST_IMPL(spawn_stdout_and_stderr_to_file_swap) {
#ifndef _WIN32
  int r;
  uv_file stdout_file;
  uv_file stderr_file;
  uv_fs_t fs_req;
  uv_stdio_container_t stdio[3];
  uv_buf_t buf;

  /* Setup. */
  unlink("stdout_file");
  unlink("stderr_file");

  init_process_options("spawn_helper6", exit_cb);

  /* open 'stdout_file' and replace STDOUT_FILENO with it */
  r = uv_fs_open(NULL,
                 &fs_req,
                 "stdout_file",
                 O_CREAT | O_RDWR,
                 S_IRUSR | S_IWUSR,
                 NULL);
  ASSERT(r != -1);
  uv_fs_req_cleanup(&fs_req);
  stdout_file = dup2(r, STDOUT_FILENO);
  ASSERT(stdout_file != -1);

  /* open 'stderr_file' and replace STDERR_FILENO with it */
  r = uv_fs_open(NULL, &fs_req, "stderr_file", O_CREAT | O_RDWR,
      S_IRUSR | S_IWUSR, NULL);
  ASSERT(r != -1);
  uv_fs_req_cleanup(&fs_req);
  stderr_file = dup2(r, STDERR_FILENO);
  ASSERT(stderr_file != -1);

  /* now we're going to swap them: the child process' stdout will be our
   * stderr_file and vice versa */
  options.stdio = stdio;
  options.stdio[0].flags = UV_IGNORE;
  options.stdio[1].flags = UV_INHERIT_FD;
  options.stdio[1].data.fd = stderr_file;
  options.stdio[2].flags = UV_INHERIT_FD;
  options.stdio[2].data.fd = stdout_file;
  options.stdio_count = 3;

  r = uv_spawn(uv_default_loop(), &process, &options);
  ASSERT(r == 0);

  r = uv_run(uv_default_loop(), UV_RUN_DEFAULT);
  ASSERT(r == 0);

  ASSERT(exit_cb_called == 1);
  ASSERT(close_cb_called == 1);

  buf = uv_buf_init(output, sizeof(output));

  /* check the content of stdout_file */
  r = uv_fs_read(NULL, &fs_req, stdout_file, &buf, 1, 0, NULL);
  ASSERT(r >= 15);
  uv_fs_req_cleanup(&fs_req);

  r = uv_fs_close(NULL, &fs_req, stdout_file, NULL);
  ASSERT(r == 0);
  uv_fs_req_cleanup(&fs_req);

  printf("output is: %s", output);
  ASSERT(strncmp("hello errworld\n", output, 15) == 0);

  /* check the content of stderr_file */
  r = uv_fs_read(NULL, &fs_req, stderr_file, &buf, 1, 0, NULL);
  ASSERT(r >= 12);
  uv_fs_req_cleanup(&fs_req);

  r = uv_fs_close(NULL, &fs_req, stderr_file, NULL);
  ASSERT(r == 0);
  uv_fs_req_cleanup(&fs_req);

  printf("output is: %s", output);
  ASSERT(strncmp("hello world\n", output, 12) == 0);

  /* Cleanup. */
  unlink("stdout_file");
  unlink("stderr_file");

  MAKE_VALGRIND_HAPPY();
  return 0;
#else
  RETURN_SKIP("Unix only test");
#endif
}